

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniversalConstraint.cpp
# Opt level: O0

void __thiscall
btUniversalConstraint::btUniversalConstraint
          (btUniversalConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *anchor,
          btVector3 *axis1,btVector3 *axis2)

{
  anon_union_8_2_443a2e82_for_btTypedConstraint_3 aVar1;
  btRigidBody *pbVar2;
  btScalar bVar3;
  btScalar bVar4;
  btVector3 *pbVar5;
  btScalar *pbVar6;
  btTransform *t;
  btScalar *yz;
  btVector3 *in_RCX;
  btRigidBody *in_RDX;
  btRigidBody *in_RSI;
  btGeneric6DofConstraint *in_RDI;
  anon_union_8_2_443a2e82_for_btTypedConstraint_3 *in_R8;
  undefined8 *in_R9;
  btVector3 bVar7;
  btTransform frameInW;
  btVector3 xAxis;
  btVector3 yAxis;
  btVector3 zAxis;
  btTransform *other;
  btTransform *in_stack_fffffffffffffcc0;
  btTransform *this_00;
  btVector3 *in_stack_fffffffffffffcc8;
  btTransform *in_stack_fffffffffffffcd0;
  btGeneric6DofConstraint *this_01;
  btScalar *in_stack_fffffffffffffcd8;
  btMatrix3x3 *in_stack_fffffffffffffce0;
  btTransform *this_02;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 useLinearReferenceFrameA;
  btTransform *this_03;
  btTransform *in_stack_fffffffffffffd30;
  btTransform *in_stack_fffffffffffffd38;
  btRigidBody *in_stack_fffffffffffffd40;
  btRigidBody *in_stack_fffffffffffffd48;
  btGeneric6DofConstraint *in_stack_fffffffffffffd50;
  btScalar local_238;
  btScalar local_234;
  btScalar local_230;
  btVector3 local_22c;
  btScalar local_21c;
  btScalar local_218;
  btScalar local_214;
  btVector3 local_210;
  btScalar local_200;
  btScalar local_1fc;
  btScalar local_1f8;
  btVector3 local_1f4;
  btScalar local_1e4;
  btScalar local_1e0;
  btScalar local_1dc;
  btVector3 local_1d8 [17];
  btTransform local_c8;
  btVector3 local_88;
  btVector3 local_78 [2];
  btVector3 local_58;
  undefined8 *local_40;
  anon_union_8_2_443a2e82_for_btTypedConstraint_3 *local_38;
  btVector3 *local_30;
  btRigidBody *local_28;
  btRigidBody *local_20;
  
  useLinearReferenceFrameA = (undefined1)((ulong)in_stack_fffffffffffffd28 >> 0x38);
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  btTransform::getIdentity();
  btTransform::getIdentity();
  btGeneric6DofConstraint::btGeneric6DofConstraint
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(bool)useLinearReferenceFrameA);
  (in_RDI->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btUniversalConstraint_002e7658;
  bVar3 = local_30->m_floats[2];
  bVar4 = local_30->m_floats[3];
  in_RDI[1].super_btTypedConstraint._vptr_btTypedConstraint = *(_func_int ***)local_30->m_floats;
  in_RDI[1].super_btTypedConstraint.super_btTypedObject = (btTypedObject)bVar3;
  in_RDI[1].super_btTypedConstraint.m_userConstraintType = (int)bVar4;
  aVar1 = local_38[1];
  in_RDI[1].super_btTypedConstraint.field_2 = *local_38;
  *(anon_union_8_2_443a2e82_for_btTypedConstraint_3 *)
   &in_RDI[1].super_btTypedConstraint.m_breakingImpulseThreshold = aVar1;
  pbVar2 = (btRigidBody *)local_40[1];
  *(undefined8 *)&in_RDI[1].super_btTypedConstraint.m_overrideNumSolverIterations = *local_40;
  in_RDI[1].super_btTypedConstraint.m_rbA = pbVar2;
  pbVar5 = btVector3::normalize((btVector3 *)in_stack_fffffffffffffcc0);
  local_58.m_floats._0_8_ = *(undefined8 *)pbVar5->m_floats;
  local_58.m_floats._8_8_ = *(undefined8 *)(pbVar5->m_floats + 2);
  pbVar5 = btVector3::normalize((btVector3 *)in_stack_fffffffffffffcc0);
  local_78[0].m_floats._0_8_ = *(undefined8 *)pbVar5->m_floats;
  local_78[0].m_floats._8_8_ = *(undefined8 *)(pbVar5->m_floats + 2);
  bVar7 = btVector3::cross((btVector3 *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_88.m_floats._8_8_ = bVar7.m_floats._8_8_;
  local_88.m_floats._0_8_ = bVar7.m_floats._0_8_;
  btTransform::btTransform(in_stack_fffffffffffffcc0);
  btTransform::setIdentity(in_stack_fffffffffffffcd0);
  btTransform::getBasis(&local_c8);
  btVector3::operator_cast_to_float_(&local_88);
  btVector3::operator_cast_to_float_(local_78);
  btVector3::operator_cast_to_float_(&local_58);
  pbVar6 = btVector3::operator_cast_to_float_(&local_88);
  this_03 = (btTransform *)(pbVar6 + 1);
  pbVar6 = btVector3::operator_cast_to_float_(local_78);
  this_02 = (btTransform *)(pbVar6 + 1);
  pbVar6 = btVector3::operator_cast_to_float_(&local_58);
  other = (btTransform *)(pbVar6 + 1);
  t = (btTransform *)btVector3::operator_cast_to_float_(&local_88);
  this_00 = (btTransform *)((t->m_basis).m_el[0].m_floats + 2);
  pbVar6 = btVector3::operator_cast_to_float_(local_78);
  pbVar5 = (btVector3 *)(pbVar6 + 2);
  yz = btVector3::operator_cast_to_float_(&local_58);
  this_01 = (btGeneric6DofConstraint *)(yz + 2);
  btMatrix3x3::setValue
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(btScalar *)this_01,
             (btScalar *)pbVar5,(btScalar *)this_00,(btScalar *)other,yz,(btScalar *)this_00,pbVar6,
             (btScalar *)other);
  btTransform::setOrigin(&local_c8,local_30);
  btRigidBody::getCenterOfMassTransform(local_20);
  btTransform::inverse(this_03);
  btTransform::operator*(this_02,t);
  btTransform::operator=(this_00,other);
  btRigidBody::getCenterOfMassTransform(local_28);
  btTransform::inverse(this_03);
  btTransform::operator*(this_02,t);
  btTransform::operator=(this_00,other);
  local_1dc = 0.0;
  local_1e0 = 0.0;
  local_1e4 = 0.0;
  btVector3::btVector3(local_1d8,&local_1dc,&local_1e0,&local_1e4);
  btGeneric6DofConstraint::setLinearLowerLimit(in_RDI,local_1d8);
  local_1f8 = 0.0;
  local_1fc = 0.0;
  local_200 = 0.0;
  btVector3::btVector3(&local_1f4,&local_1f8,&local_1fc,&local_200);
  btGeneric6DofConstraint::setLinearUpperLimit(in_RDI,&local_1f4);
  local_214 = 0.0;
  local_218 = -1.5607964;
  local_21c = -3.1315928;
  btVector3::btVector3(&local_210,&local_214,&local_218,&local_21c);
  btGeneric6DofConstraint::setAngularLowerLimit(this_01,pbVar5);
  local_230 = 0.0;
  local_234 = 1.5607964;
  local_238 = 3.1315928;
  btVector3::btVector3(&local_22c,&local_230,&local_234,&local_238);
  btGeneric6DofConstraint::setAngularUpperLimit(this_01,pbVar5);
  return;
}

Assistant:

btUniversalConstraint::btUniversalConstraint(btRigidBody& rbA, btRigidBody& rbB, const btVector3& anchor, const btVector3& axis1, const btVector3& axis2)
: btGeneric6DofConstraint(rbA, rbB, btTransform::getIdentity(), btTransform::getIdentity(), true),
 m_anchor(anchor),
 m_axis1(axis1),
 m_axis2(axis2)
{
	// build frame basis
	// 6DOF constraint uses Euler angles and to define limits
	// it is assumed that rotational order is :
	// Z - first, allowed limits are (-PI,PI);
	// new position of Y - second (allowed limits are (-PI/2 + epsilon, PI/2 - epsilon), where epsilon is a small positive number 
	// used to prevent constraint from instability on poles;
	// new position of X, allowed limits are (-PI,PI);
	// So to simulate ODE Universal joint we should use parent axis as Z, child axis as Y and limit all other DOFs
	// Build the frame in world coordinate system first
	btVector3 zAxis = m_axis1.normalize();
	btVector3 yAxis = m_axis2.normalize();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system
	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue(	xAxis[0], yAxis[0], zAxis[0],	
									xAxis[1], yAxis[1], zAxis[1],
									xAxis[2], yAxis[2], zAxis[2]);
	frameInW.setOrigin(anchor);
	// now get constraint frame in local coordinate systems
	m_frameInA = rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = rbB.getCenterOfMassTransform().inverse() * frameInW;
	// sei limits
	setLinearLowerLimit(btVector3(0., 0., 0.));
	setLinearUpperLimit(btVector3(0., 0., 0.));
	setAngularLowerLimit(btVector3(0.f, -SIMD_HALF_PI + UNIV_EPS, -SIMD_PI + UNIV_EPS));
	setAngularUpperLimit(btVector3(0.f,  SIMD_HALF_PI - UNIV_EPS,  SIMD_PI - UNIV_EPS));
}